

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_3)

{
  FILE *__stream;
  undefined8 uVar1;
  stringstream stream;
  UnitTest *in_stack_00000158;
  ostream *in_stack_00000160;
  FILE *jsonout;
  string local_1d8 [48];
  stringstream local_1a8 [32];
  stringstream *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe90;
  
  __stream = (FILE *)OpenFileForWriting(in_stack_fffffffffffffe90);
  std::__cxx11::stringstream::stringstream(local_1a8);
  PrintJsonUnitTest(in_stack_00000160,in_stack_00000158);
  StringStreamToString(in_stack_fffffffffffffe78);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s",uVar1);
  std::__cxx11::string::~string(local_1d8);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* jsonout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}